

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void printX509Name(X509_name_st *name)

{
  size_t sVar1;
  int iVar2;
  uint uVar3;
  X509_NAME_ENTRY *ne;
  ASN1_OBJECT *o;
  ASN1_STRING *string;
  C *pCVar4;
  C *pCVar5;
  int loc;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> local_70;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> local_50;
  
  iVar2 = X509_NAME_entry_count((X509_NAME *)name);
  if (0 < iVar2) {
    loc = 0;
    do {
      ne = X509_NAME_get_entry((X509_NAME *)name,loc);
      o = X509_NAME_ENTRY_get_object(ne);
      string = X509_NAME_ENTRY_get_data(ne);
      uVar3 = OBJ_obj2nid(o);
      axl::cry::getAsn1ObjectString((String *)&local_70,(ASN1_OBJECT *)o);
      sVar1 = local_70.m_length;
      pCVar5 = local_70.m_p;
      axl::cry::getAsn1StringString((String *)&local_50,(ASN1_STRING *)string);
      if (sVar1 == 0) {
        pCVar5 = &axl::sl::StringDetailsImpl<char>::getEmptyString()::emptyString;
      }
      pCVar4 = &axl::sl::StringDetailsImpl<char>::getEmptyString()::emptyString;
      if (local_50.m_length != 0) {
        pCVar4 = local_50.m_p;
      }
      printf("    %4d: %s: %s\n",(ulong)uVar3,pCVar5,pCVar4);
      axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_50);
      axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_70);
      loc = loc + 1;
    } while (iVar2 != loc);
  }
  return;
}

Assistant:

void
printX509Name(X509_name_st* name) {
	int count = X509_NAME_entry_count(name);
	for (int i = 0; i < count; i++) {
		X509_NAME_ENTRY* entry = X509_NAME_get_entry(name, i);
		ASN1_OBJECT* object = X509_NAME_ENTRY_get_object(entry);
		ASN1_STRING* data = X509_NAME_ENTRY_get_data(entry);

		printf("    %4d: %s: %s\n", OBJ_obj2nid(object), cry::getAsn1ObjectString(object).sz(), cry::getAsn1StringString(data).sz());
	}
}